

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void CheckTH(TidyDocImpl *doc,Node *node)

{
  bool bVar1;
  Bool BVar2;
  uint uVar3;
  ctmbstr pString;
  AttVal *local_30;
  AttVal *av;
  ctmbstr word;
  Bool HasAbbr;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  bVar1 = false;
  BVar2 = Level3_Enabled(doc);
  if (BVar2 != no) {
    for (local_30 = node->attributes; local_30 != (AttVal *)0x0; local_30 = local_30->next) {
      if (((local_30 != (AttVal *)0x0) && (local_30->dict != (Attribute *)0x0)) &&
         (local_30->dict->id == TidyAttr_ABBR)) {
        if ((local_30->value != (tmbstr)0x0) && (BVar2 = IsWhitespace(local_30->value), BVar2 == no)
           ) {
          bVar1 = true;
        }
        if ((local_30->value == (tmbstr)0x0) ||
           (uVar3 = prvTidytmbstrlen(local_30->value), uVar3 == 0)) {
          bVar1 = true;
          prvTidyReportAccessError(doc,node,0x2cf);
        }
        BVar2 = IsWhitespace(local_30->value);
        if ((BVar2 == yes) && (uVar3 = prvTidytmbstrlen(local_30->value), uVar3 != 0)) {
          bVar1 = true;
          prvTidyReportAccessError(doc,node,0x2d0);
        }
      }
    }
    pString = textFromOneNode(doc,node->content);
    if ((((pString != (ctmbstr)0x0) && (BVar2 = IsWhitespace(pString), BVar2 == no)) &&
        (uVar3 = prvTidytmbstrlen(pString), 0xf < uVar3)) && (!bVar1)) {
      prvTidyReportAccessError(doc,node,0x2ce);
    }
  }
  return;
}

Assistant:

static void CheckTH( TidyDocImpl* doc, Node* node )
{
    Bool HasAbbr = no;
    ctmbstr word = NULL;
    AttVal* av;

    if (Level3_Enabled( doc ))
    {
        /* Checks TH element for 'ABBR' attribute */
        for (av = node->attributes; av != NULL; av = av->next)
        {
            if ( attrIsABBR(av) )
            {
                /* Value must not be NULL and must be less than 15 characters */
                if ((av->value != NULL)&&
                    (IsWhitespace (av->value) == no))
                {
                    HasAbbr = yes;
                }

                if ((av->value == NULL)||
                    (TY_(tmbstrlen)(av->value) == 0))
                {
                    HasAbbr = yes;
                    TY_(ReportAccessError)( doc, node, TABLE_MAY_REQUIRE_HEADER_ABBR_NULL);
                }
                
                if ((IsWhitespace (av->value) == yes)&&
                    (TY_(tmbstrlen)(av->value) > 0))
                {
                    HasAbbr = yes;
                    TY_(ReportAccessError)( doc, node, TABLE_MAY_REQUIRE_HEADER_ABBR_SPACES);
                }
            }
        }

        /* If the header is greater than 15 characters, an abbreviation is needed */
        word = textFromOneNode( doc, node->content);

        if ((word != NULL)&&
            (IsWhitespace (word) == no))
        {
            /* Must have 'ABBR' attribute if header is > 15 characters */
            if ((TY_(tmbstrlen)(word) > 15)&&
                (HasAbbr == no))
            {
                TY_(ReportAccessError)( doc, node, TABLE_MAY_REQUIRE_HEADER_ABBR);
            }
        }
    }
}